

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

int __thiscall
TPZSkylMatrix<double>::Redim(TPZSkylMatrix<double> *this,int64_t newDim,int64_t param_3)

{
  long lVar1;
  long in_RSI;
  long *in_RDI;
  TPZVec<double_*> *unaff_retaddr;
  int64_t in_stack_00000008;
  int64_t in_stack_00000010;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  lVar1 = (**(code **)(*in_RDI + 0x60))();
  if (in_RSI == lVar1) {
    (**(code **)(*in_RDI + 0x78))();
  }
  else {
    (**(code **)(*in_RDI + 0x270))();
    TPZVec<double_*>::Resize
              (unaff_retaddr,CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    TPZVec<double_*>::Fill
              ((TPZVec<double_*> *)newDim,(double **)param_3,in_stack_00000010,in_stack_00000008);
    in_RDI[2] = in_RSI;
    in_RDI[1] = in_RSI;
    *(undefined1 *)(in_RDI + 3) = 0;
  }
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::Redim( int64_t newDim , int64_t)
{
	if ( newDim == this->Dim() )
    {
		Zero();
		return( 1 );
    }
	
	Clear();
	fElem.Resize(newDim);
	fElem.Fill(0);
	this->fRow = this->fCol = newDim;
	this->fDecomposed = 0;
	return( 1 );
}